

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall
Simulator::simulation
          (Simulator *this,MultipleShootingCGMRES *cgmres_solver,VectorXd *initial_state_vec,
          double start_time,double end_time,double sampling_period,string *savefile_name)

{
  NMPCModel *this_00;
  pointer pcVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  void *__ptr;
  undefined8 *puVar8;
  double *pdVar9;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  Index rows;
  ulong uVar15;
  Index size;
  undefined4 uVar16;
  double dVar17;
  undefined8 in_XMM1_Qb;
  VectorXd current_state_vec;
  VectorXd control_input_vec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  ofstream conditions_data;
  ofstream error_data;
  ofstream control_input_data;
  ofstream state_data;
  VectorXd local_908;
  double local_8f8;
  string *local_8f0;
  double local_8e8;
  uint local_8dc;
  VectorXd local_8d8;
  double local_8c8;
  double local_8c0;
  undefined1 local_8b8 [16];
  Simulator *local_8a0;
  MultipleShootingCGMRES *local_898;
  size_t local_890;
  NumericalIntegrator *local_888;
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  double *local_860;
  ulong local_858;
  void *local_848;
  ulong local_840;
  undefined1 *local_830;
  filebuf local_828 [8];
  undefined1 local_820 [232];
  ios_base aiStack_738 [264];
  undefined1 *local_630;
  filebuf local_628 [8];
  undefined1 local_620 [232];
  ios_base aiStack_538 [264];
  undefined1 *local_430;
  filebuf local_428 [8];
  undefined1 local_420 [232];
  ios_base aiStack_338 [264];
  undefined1 *local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_8b8._8_8_ = in_XMM1_Qb;
  local_8b8._0_8_ = end_time;
  this_00 = &this->model_;
  local_8f0 = savefile_name;
  local_8e8 = sampling_period;
  local_8c8 = start_time;
  local_8a0 = this;
  local_898 = cgmres_solver;
  uVar5 = NMPCModel::dimState(this_00);
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((int)uVar5 < 0) {
LAB_001079ec:
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pdVar7 = local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (uVar5 != 0) {
    pdVar7 = (double *)malloc((ulong)uVar5 * 8);
    if ((uVar5 != 1) && (((ulong)pdVar7 & 0xf) != 0)) goto LAB_0010799f;
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar7
  ;
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (ulong)uVar5;
  uVar5 = NMPCModel::dimState(this_00);
  if ((int)uVar5 < 0) goto LAB_001079ec;
  uVar15 = (ulong)uVar5;
  if (uVar5 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(uVar15 * 8);
    if ((uVar5 != 1) && (((ulong)__ptr & 0xf) != 0)) goto LAB_0010799f;
    if (__ptr == (void *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  uVar6 = NMPCModel::dimControlInput(this_00);
  local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((int)uVar6 < 0) goto LAB_001079ec;
  pdVar7 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  if (uVar6 != 0) {
    pdVar7 = (double *)malloc((ulong)uVar6 * 8);
    if ((uVar6 != 1) && (((ulong)pdVar7 & 0xf) != 0)) goto LAB_0010799f;
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar7
  ;
  pcVar1 = (local_8f0->_M_dataplus)._M_p;
  local_8dc = uVar5;
  local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (ulong)uVar6;
  local_430 = local_420;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_430,pcVar1,pcVar1 + local_8f0->_M_string_length);
  std::__cxx11::string::append((char *)&local_430);
  std::ofstream::ofstream(&local_230,(string *)&local_430,_S_out);
  if (local_430 != local_420) {
    operator_delete(local_430);
  }
  pcVar1 = (local_8f0->_M_dataplus)._M_p;
  local_630 = local_620;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_630,pcVar1,pcVar1 + local_8f0->_M_string_length);
  std::__cxx11::string::append((char *)&local_630);
  std::ofstream::ofstream(&local_430,(string *)&local_630,_S_out);
  if (local_630 != local_620) {
    operator_delete(local_630);
  }
  pcVar1 = (local_8f0->_M_dataplus)._M_p;
  local_830 = local_820;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_830,pcVar1,pcVar1 + local_8f0->_M_string_length);
  std::__cxx11::string::append((char *)&local_830);
  std::ofstream::ofstream(&local_630,(string *)&local_830,_S_out);
  if (local_830 != local_820) {
    operator_delete(local_830);
  }
  pcVar1 = (local_8f0->_M_dataplus)._M_p;
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_880,pcVar1,pcVar1 + local_8f0->_M_string_length);
  std::__cxx11::string::append((char *)local_880);
  std::ofstream::ofstream(&local_830,(string *)local_880,_S_out);
  if (local_880[0] != local_870) {
    operator_delete(local_880[0]);
  }
  pdVar7 = (initial_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_data;
  uVar12 = (initial_state_vec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
           m_storage.m_rows;
  pdVar9 = local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
  ;
  uVar13 = local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  if (local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      uVar12) {
    if ((long)uVar12 < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    free(local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar13 = uVar12;
    if (uVar12 != 0) {
      if (uVar12 >> 0x3d == 0) {
        pdVar9 = (double *)malloc(uVar12 * 8);
        if (uVar12 != 1 && ((ulong)pdVar9 & 0xf) != 0) {
LAB_0010799f:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar9 != (double *)0x0) goto LAB_0010734e;
      }
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ios::widen;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pdVar9 = (double *)0x0;
  }
LAB_0010734e:
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar13
  ;
  local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar9
  ;
  uVar13 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar12) {
    lVar14 = 0;
    do {
      pdVar9 = pdVar7 + lVar14;
      dVar17 = pdVar9[1];
      local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar14] = *pdVar9;
      (local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
      lVar14)[1] = dVar17;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar12) {
    do {
      local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar13] = pdVar7[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start simulation",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_8f8 = 0.0;
  if (local_8c8 < (double)local_8b8._0_8_) {
    local_888 = (NumericalIntegrator *)&local_8a0->field_0x40;
    local_890 = uVar15 * 8;
    uVar6 = uVar5 & 0x7ffffffe;
    local_8f8 = 0.0;
    dVar17 = local_8c8;
    do {
      local_8c0 = dVar17;
      dVar17 = MultipleShootingCGMRES::getError(local_898,dVar17,&local_908);
      saveData(local_8a0,(ofstream *)&local_230,(ofstream *)&local_430,(ofstream *)&local_630,dVar17
               ,&local_908,&local_8d8,dVar17);
      local_848 = __ptr;
      local_840 = uVar15;
      NumericalIntegrator::rungeKuttaGill
                (local_888,local_8c0,&local_908,&local_8d8,local_8e8,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                 &local_848);
      lVar14 = std::chrono::_V2::system_clock::now();
      local_860 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_data;
      local_858 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows;
      if (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          < 0 && local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      MultipleShootingCGMRES::controlUpdate
                (local_898,local_8c0,local_8e8,&local_908,
                 (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                 &local_860);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"control_input_vec : ",0x14);
      poVar10 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_8d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      lVar11 = std::chrono::_V2::system_clock::now();
      pdVar7 = local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar12 = local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows;
      if (local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uVar15) {
        free(local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        uVar4 = local_8dc;
        uVar12 = uVar15;
        if (local_8dc == 0) {
          pdVar7 = (double *)0x0;
        }
        else {
          pdVar7 = (double *)malloc(local_890);
          if ((uVar4 != 1) && (((ulong)pdVar7 & 0xf) != 0)) goto LAB_0010799f;
          if (pdVar7 == (double *)0x0) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar8 = std::ios::widen;
            __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
        }
      }
      local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           uVar12;
      local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar7;
      if (1 < local_8dc) {
        uVar12 = 0;
        do {
          pdVar7 = (double *)((long)__ptr + uVar12 * 8);
          dVar17 = pdVar7[1];
          local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar12] = *pdVar7;
          (local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          + uVar12)[1] = dVar17;
          uVar12 = uVar12 + 2;
        } while (uVar12 < uVar6);
      }
      uVar12 = (ulong)uVar6;
      if (uVar6 != uVar5) {
        do {
          local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar12] = *(double *)((long)__ptr + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar15 != uVar12);
      }
      local_8f8 = local_8f8 + (double)((lVar11 - lVar14) / 1000) * 1e-06;
      dVar17 = local_8c0 + local_8e8;
    } while (dVar17 < (double)local_8b8._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End simulation",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Total CPU time for control update: ",0x23);
  poVar10 = std::ostream::_M_insert<double>(local_8f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [sec]",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"simulation name: ",0x11)
  ;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_830,(local_8f0->_M_dataplus)._M_p,
                       local_8f0->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"simulation time: ",0x11)
  ;
  uVar16 = local_8b8._12_4_;
  dVar17 = local_8b8._0_8_ - local_8c8;
  local_8b8._8_4_ = local_8b8._8_4_;
  local_8b8._0_8_ = dVar17;
  local_8b8._12_4_ = uVar16;
  poVar10 = std::ostream::_M_insert<double>(dVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_830,"CPU time for control update (total): ",0x25);
  poVar10 = std::ostream::_M_insert<double>(local_8f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"sampling time: ",0xf);
  poVar10 = std::ostream::_M_insert<double>(local_8e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [sec]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_830,"CPU time for control update (1step): ",0x25);
  poVar10 = std::ostream::_M_insert<double>
                      (local_8f8 / (double)(int)((double)local_8b8._0_8_ / local_8e8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," [sec]\n",7);
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  uVar3 = __filebuf;
  puVar2 = _VTT;
  local_830 = _VTT;
  *(undefined8 *)(local_828 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_828);
  std::ios_base::~ios_base(aiStack_738);
  local_630 = puVar2;
  *(undefined8 *)(local_628 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_628);
  std::ios_base::~ios_base(aiStack_538);
  local_430 = puVar2;
  *(undefined8 *)(local_428 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_428);
  std::ios_base::~ios_base(aiStack_338);
  local_230 = puVar2;
  *(undefined8 *)(local_228 + *(long *)(puVar2 + -0x18) + -8) = uVar3;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(aiStack_138);
  free(local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(__ptr);
  free(local_908.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void Simulator::simulation(MultipleShootingCGMRES cgmres_solver, const Eigen::VectorXd& initial_state_vec, const double start_time, const double end_time, const double sampling_period, const std::string savefile_name)
{
    Eigen::VectorXd current_state_vec(model_.dimState()), next_state_vec(model_.dimState()), control_input_vec(model_.dimControlInput());
    std::chrono::system_clock::time_point start_clock, end_clock;

    std::ofstream state_data(savefile_name + "_state.dat");
    std::ofstream control_input_data(savefile_name + "_control_input.dat");
    std::ofstream error_data(savefile_name + "_error.dat");
    std::ofstream conditions_data(savefile_name + "_conditions.dat");

    double total_time = 0;
    current_state_vec = initial_state_vec;
    std::cout << "Start simulation" << std::endl;
    for(double current_time=start_time; current_time<end_time; current_time+= sampling_period){
        saveData(state_data, control_input_data, error_data, current_time, current_state_vec, control_input_vec, cgmres_solver.getError(current_time, current_state_vec));

        // Compute the next state vector using the 4th Runge-Kutta-Gill method.
        rungeKuttaGill(current_time, current_state_vec, control_input_vec, sampling_period, next_state_vec);

        // Update the solution and measure computational time.
        start_clock = std::chrono::system_clock::now();
        cgmres_solver.controlUpdate(current_time, sampling_period, current_state_vec, control_input_vec);
        std::cout << "control_input_vec : " << control_input_vec << std::endl;

        end_clock = std::chrono::system_clock::now();

        // Convert computational time to seconds.
        double step_time = std::chrono::duration_cast<std::chrono::microseconds>(end_clock-start_clock).count();
        step_time *= 1e-06;
        total_time += step_time;

        current_state_vec = next_state_vec;
    }
    std::cout << "End simulation" << std::endl;
    std::cout << "Total CPU time for control update: " << total_time << " [sec]" << std::endl;

    // Save simulation conditions.
    conditions_data << "simulation name: " << savefile_name << "\n";
    conditions_data << "simulation time: " << end_time-start_time << " [sec]\n";
    conditions_data << "CPU time for control update (total): " << total_time << " [sec]\n";
    conditions_data << "sampling time: " << sampling_period << " [sec]\n";
    conditions_data << "CPU time for control update (1step): " << total_time/((int)( (end_time-start_time)/(sampling_period))) << " [sec]\n";

    state_data.close();
    control_input_data.close();
    error_data.close();
    conditions_data.close();
}